

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

hash_t __thiscall duckdb::Expression::Hash(Expression *this)

{
  ulong uVar1;
  hash_t hVar2;
  hash_t hash;
  ulong local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  uVar1 = (ulong)(this->super_BaseExpression).type * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  uVar1 = uVar1 >> 0x20 ^ uVar1;
  local_40 = uVar1;
  hVar2 = LogicalType::Hash(&this->return_type);
  local_40 = hVar2 ^ uVar1;
  local_38._8_8_ = 0;
  pcStack_20 = ::std::
               _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression.cpp:110:40)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/expression.cpp:110:40)>
             ::_M_manager;
  local_38._M_unused._M_object = &local_40;
  ExpressionIterator::EnumerateChildren
            (this,(function<void_(const_duckdb::Expression_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return local_40;
}

Assistant:

hash_t Expression::Hash() const {
	hash_t hash = duckdb::Hash<uint32_t>(static_cast<uint32_t>(type));
	hash = CombineHash(hash, return_type.Hash());
	ExpressionIterator::EnumerateChildren(*this,
	                                      [&](const Expression &child) { hash = CombineHash(child.Hash(), hash); });
	return hash;
}